

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

char * fmt_symbol(adh_symbol_t symbol)

{
  ushort **ppuVar1;
  char *__format;
  ulong uVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  
  iVar3 = (int)CONCAT62(in_register_0000003a,symbol);
  if (iVar3 != -2) {
    uVar2 = CONCAT62(in_register_0000003a,symbol) & 0xffffffff;
    if (iVar3 == -1) {
      builtin_strncpy(fmt_symbol::str,"NYT",4);
    }
    else {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(short)uVar2] & 2) == 0) {
        __format = "\'%c\'";
      }
      else {
        __format = "x%02X";
      }
      snprintf(fmt_symbol::str,100,__format,uVar2);
    }
    return fmt_symbol::str;
  }
  builtin_strncpy(fmt_symbol::str," ° ",5);
  return fmt_symbol::str;
}

Assistant:

char * fmt_symbol(adh_symbol_t symbol) {
    static char str[MAX_SYMBOL_STR] = {0};
    if(symbol == ADH_NYT_CODE)
        snprintf(str, sizeof(str), "NYT");
    else if(symbol ==  ADH_OLD_NYT_CODE)
        snprintf(str, sizeof(str), " ° ");
    else if(iscntrl(symbol))
        snprintf(str, sizeof(str), "x%02X", symbol);
    else
        snprintf(str, sizeof(str), "'%c'", symbol);

    return str;
}